

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwhatsthis.cpp
# Opt level: O1

void __thiscall QWhatsThisPrivate::~QWhatsThisPrivate(QWhatsThisPrivate *this)

{
  Data *pDVar1;
  long in_FS_OFFSET;
  code *local_38;
  undefined8 uStack_30;
  QWhatsThisPrivate *local_28;
  undefined8 uStack_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined ***)this = &PTR_metaObject_007fae50;
  pDVar1 = (this->action).wp.d;
  if (((pDVar1 != (Data *)0x0) && (*(int *)(pDVar1 + 4) != 0)) &&
     ((this->action).wp.value != (QObject *)0x0)) {
    QAction::setChecked(SUB81((this->action).wp.value,0));
  }
  QGuiApplication::restoreOverrideCursor();
  local_38 = QFont::strikeOut;
  uStack_30 = 0xaaaaaaaa0000000d;
  uStack_20 = 0xaaaaaaaaffffffff;
  local_28 = this;
  QAccessible::updateAccessibility((QAccessibleEvent *)&local_38);
  instance = (QWhatsThisPrivate *)0x0;
  QAccessibleEvent::~QAccessibleEvent((QAccessibleEvent *)&local_38);
  pDVar1 = (this->action).wp.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    *(int *)pDVar1 = *(int *)pDVar1 + -1;
    UNLOCK();
    if ((*(int *)pDVar1 == 0) && (pDVar1 = (this->action).wp.d, pDVar1 != (Data *)0x0)) {
      operator_delete(pDVar1);
    }
  }
  QObject::~QObject(&this->super_QObject);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QWhatsThisPrivate::~QWhatsThisPrivate()
{
#if QT_CONFIG(action)
    if (action)
        action->setChecked(false);
#endif // QT_CONFIG(action)
#ifndef QT_NO_CURSOR
    QGuiApplication::restoreOverrideCursor();
#endif
#if QT_CONFIG(accessibility)
    QAccessibleEvent event(this, QAccessible::ContextHelpEnd);
    QAccessible::updateAccessibility(&event);
#endif
    instance = nullptr;
}